

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_i(int *out_h,int *out_s,int *out_v,int *out_a,nk_color in)

{
  float local_40;
  float local_3c;
  float a;
  float v;
  float s;
  float h;
  int *out_a_local;
  int *out_v_local;
  int *out_s_local;
  int *out_h_local;
  nk_color in_local;
  
  _s = (uint *)out_a;
  out_a_local = out_v;
  out_v_local = out_s;
  out_s_local = out_h;
  out_h_local._4_4_ = in;
  nk_color_hsva_f(&v,&a,&local_3c,&local_40,in);
  *out_s_local = (int)(v * 255.0) & 0xff;
  *out_v_local = (int)(a * 255.0) & 0xff;
  *out_a_local = (int)(local_3c * 255.0) & 0xff;
  *_s = (int)(local_40 * 255.0) & 0xff;
  return;
}

Assistant:

NK_API void
nk_color_hsva_i(int *out_h, int *out_s, int *out_v,
                int *out_a, struct nk_color in)
{
    float h,s,v,a;
    nk_color_hsva_f(&h, &s, &v, &a, in);
    *out_h = (nk_byte)(h * 255.0f);
    *out_s = (nk_byte)(s * 255.0f);
    *out_v = (nk_byte)(v * 255.0f);
    *out_a = (nk_byte)(a * 255.0f);
}